

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O1

void __thiscall pg::SPMSolver::pm_stream(SPMSolver *this,ostream *out,int *pm)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  iVar1 = *pm;
  iVar2 = pm[1];
  std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
  if (iVar1 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>(out," \x1b[1;33mTe\x1b[m",0xd);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    std::ostream::operator<<(out,*pm);
  }
  if (iVar2 == -1) {
    std::__ostream_insert<char,std::char_traits<char>>(out," \x1b[1;33mTo\x1b[m",0xd);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    std::ostream::operator<<(out,pm[1]);
  }
  if (2 < this->k) {
    uVar3 = 2;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      if ((uVar3 & 1) == 0) {
        if (iVar1 != -1) goto LAB_0016072c;
LAB_00160738:
        iVar4 = 0;
      }
      else {
        if (iVar2 == -1) goto LAB_00160738;
LAB_0016072c:
        iVar4 = pm[uVar3];
      }
      std::ostream::operator<<(out,iVar4);
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < this->k);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," } ",3);
  return;
}

Assistant:

void
SPMSolver::pm_stream(std::ostream &out, int *pm)
{
    bool top_e = pm[0] == -1;
    bool top_o = pm[1] == -1;
    out << " {";
    if (top_e) out << " \033[1;33mTe\033[m";
    else out << " " << pm[0];
    if (top_o) out << " \033[1;33mTo\033[m";
    else out << " " << pm[1];
    for (int i=2; i<k; i++) {
        if (i&1) out << " " << (top_o ? 0 : pm[i]);
        else     out << " " << (top_e ? 0 : pm[i]);
    }
    out << " } ";
}